

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yin.c
# Opt level: O0

yin_t * yin_init(int frame_size,float search_threshold,float search_range,int smooth_window)

{
  yin_t *pyVar1;
  fixed32 **ppfVar2;
  uint16 *puVar3;
  yin_t *pe;
  int smooth_window_local;
  float search_range_local;
  float search_threshold_local;
  int frame_size_local;
  
  pyVar1 = (yin_t *)__ckd_calloc__(1,0x20,
                                   "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/fe/yin.c"
                                   ,0x88);
  search_range_local._0_2_ = (uint16)frame_size;
  pyVar1->frame_size = search_range_local._0_2_;
  pyVar1->search_threshold = (uint16)(int)(search_threshold * 32768.0);
  pyVar1->search_range = (uint16)(int)(search_range * 32768.0);
  pyVar1->wsize = (char)(smooth_window << 1) + '\x01';
  ppfVar2 = (fixed32 **)
            __ckd_calloc_2d__((ulong)pyVar1->wsize,(long)(int)(pyVar1->frame_size / 2),4,
                              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/fe/yin.c"
                              ,0x8f);
  pyVar1->diff_window = ppfVar2;
  puVar3 = (uint16 *)
           __ckd_calloc__((ulong)pyVar1->wsize,2,
                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/fe/yin.c"
                          ,0x91);
  pyVar1->period_window = puVar3;
  return pyVar1;
}

Assistant:

yin_t *
yin_init(int frame_size, float search_threshold,
         float search_range, int smooth_window)
{
    yin_t *pe;

    pe = ckd_calloc(1, sizeof(*pe));
    pe->frame_size = frame_size;
    pe->search_threshold = (uint16)(search_threshold * 32768);
    pe->search_range = (uint16)(search_range * 32768);
    pe->wsize = smooth_window * 2 + 1;
    pe->diff_window = ckd_calloc_2d(pe->wsize,
                                    pe->frame_size / 2,
                                    sizeof(**pe->diff_window));
    pe->period_window = ckd_calloc(pe->wsize,
                                   sizeof(*pe->period_window));
    return pe;
}